

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::ExtendSub
              (double **extended_f0,int *boundary_list,int number_of_sections,
              double **selected_extended_f0,int *selected_boundary_list)

{
  int iVar1;
  int iVar2;
  double **in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int j;
  int i;
  int ed;
  int st;
  double mean_f0;
  int count;
  double threshold;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_40;
  undefined4 local_34;
  
  local_34 = 0;
  local_40 = 0.0;
  for (local_4c = 0; local_4c < in_EDX; local_4c = local_4c + 1) {
    iVar2 = *(int *)(in_RSI + (long)(local_4c * 2 + 1) * 4);
    iVar1 = *(int *)(in_RSI + (long)(local_4c << 1) * 4);
    for (local_50 = iVar1; local_50 < iVar2; local_50 = local_50 + 1) {
      local_40 = *(double *)(*(long *)(in_RDI + (long)local_4c * 8) + (long)local_50 * 8) + local_40
      ;
    }
    local_40 = local_40 / (double)(iVar2 - iVar1);
    if (2200.0 / local_40 < (double)(iVar2 - iVar1)) {
      Swap(local_34,local_4c,in_RCX,in_R8);
      local_34 = local_34 + 1;
    }
  }
  return local_34;
}

Assistant:

static int ExtendSub(const double * const *extended_f0,
    const int *boundary_list, int number_of_sections,
    double **selected_extended_f0, int *selected_boundary_list) {
  double threshold = 2200.0;
  int count = 0;
  double mean_f0 = 0.0;
  int st, ed;
  for (int i = 0; i < number_of_sections; ++i) {
    st = boundary_list[i * 2];
    ed = boundary_list[i * 2 + 1];
    for (int j = st; j < ed; ++j) mean_f0 += extended_f0[i][j];
    mean_f0 /= ed - st;
    if (threshold / mean_f0 < ed - st)
      Swap(count++, i, selected_extended_f0, selected_boundary_list);
  }
  return count;
}